

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O0

void __thiscall CDirectiveData::encodeNormal(CDirectiveData *this)

{
  uint64_t uVar1;
  undefined8 uVar2;
  bool bVar3;
  size_type sVar4;
  reference this_00;
  size_t sVar5;
  string *psVar6;
  char *pcVar7;
  value_type_conflict3 local_a0;
  int64_t local_98;
  int64_t num_3;
  int32_t local_84;
  value_type_conflict3 vStack_80;
  int32_t num_2;
  int64_t num_1;
  ulong local_70;
  uint64_t num;
  size_t l;
  undefined4 local_58;
  bool hadNonAscii;
  undefined1 local_48 [8];
  ExpressionValue value;
  size_t i;
  CDirectiveData *this_local;
  
  std::vector<long,_std::allocator<long>_>::clear(&this->normalData);
  for (value.strValue._value.field_2._8_8_ = 0; uVar2 = value.strValue._value.field_2._8_8_,
      sVar4 = std::vector<Expression,_std::allocator<Expression>_>::size(&this->entries),
      (ulong)uVar2 < sVar4;
      value.strValue._value.field_2._8_8_ = value.strValue._value.field_2._8_8_ + 1) {
    this_00 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                        (&this->entries,value.strValue._value.field_2._8_8_);
    Expression::evaluate((ExpressionValue *)local_48,this_00);
    bVar3 = ExpressionValue::isValid((ExpressionValue *)local_48);
    if (bVar3) {
      bVar3 = ExpressionValue::isString((ExpressionValue *)local_48);
      if (bVar3) {
        l._7_1_ = 0;
        for (num = 0; uVar1 = num, sVar5 = StringLiteral::size((StringLiteral *)&value.field_1),
            uVar1 < sVar5; num = num + 1) {
          psVar6 = StringLiteral::string_abi_cxx11_((StringLiteral *)&value.field_1);
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)psVar6);
          num_1 = (int64_t)*pcVar7;
          local_70 = num_1;
          std::vector<long,_std::allocator<long>_>::push_back(&this->normalData,&num_1);
          if ((0x7f < local_70) && ((l._7_1_ & 1) == 0)) {
            Logger::queueError<>(Error,"Non-ASCII character in data directive. Use .string instead")
            ;
            l._7_1_ = 1;
          }
        }
      }
      else {
        bVar3 = ExpressionValue::isInt((ExpressionValue *)local_48);
        if (bVar3) {
          vStack_80 = value._0_8_;
          std::vector<long,_std::allocator<long>_>::push_back
                    (&this->normalData,&stack0xffffffffffffff80);
        }
        else {
          bVar3 = ExpressionValue::isFloat((ExpressionValue *)local_48);
          if ((bVar3) && (this->mode == U32)) {
            local_84 = getFloatBits((float)(double)value._0_8_);
            num_3 = (int64_t)local_84;
            std::vector<long,_std::allocator<long>_>::push_back(&this->normalData,&num_3);
          }
          else {
            bVar3 = ExpressionValue::isFloat((ExpressionValue *)local_48);
            if ((bVar3) && (this->mode == U64)) {
              local_98 = getDoubleBits((double)value._0_8_);
              std::vector<long,_std::allocator<long>_>::push_back(&this->normalData,&local_98);
            }
            else {
              Logger::queueError<>(Error,"Invalid expression type");
            }
          }
        }
      }
      local_58 = 0;
    }
    else {
      Logger::queueError<>(Error,"Invalid expression");
      local_58 = 4;
    }
    ExpressionValue::~ExpressionValue((ExpressionValue *)local_48);
  }
  if ((this->writeTermination & 1U) != 0) {
    local_a0 = 0;
    std::vector<long,_std::allocator<long>_>::push_back(&this->normalData,&local_a0);
  }
  return;
}

Assistant:

void CDirectiveData::encodeNormal()
{
	normalData.clear();
	for (size_t i = 0; i < entries.size(); i++)
	{
		ExpressionValue value = entries[i].evaluate();
		if (!value.isValid())
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			continue;
		}

		if (value.isString())
		{
			bool hadNonAscii = false;
			for (size_t l = 0; l < value.strValue.size(); l++)
			{
				uint64_t num = value.strValue.string()[l];
				normalData.push_back(num);

				if (num >= 0x80 && !hadNonAscii)
				{
					Logger::queueError(Logger::Error, "Non-ASCII character in data directive. Use .string instead");
					hadNonAscii = true;
				}
			}
		} else if (value.isInt())
		{
			int64_t num = value.intValue;
			normalData.push_back(num);
		} else if (value.isFloat() && mode == EncodingMode::U32)
		{
			int32_t num = getFloatBits((float)value.floatValue);
			normalData.push_back(num);
		} else if(value.isFloat() && mode == EncodingMode::U64) {
			int64_t num = getDoubleBits((double)value.floatValue);
			normalData.push_back(num);
		} else {
			Logger::queueError(Logger::Error, "Invalid expression type");
		}
	}

	if (writeTermination)
	{
		normalData.push_back(0);
	}
}